

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AVLTreeNode.cpp
# Opt level: O1

void __thiscall itis::AVLTreeNode<int>::updateValues(AVLTreeNode<int> *this)

{
  AVLTreeNode<int> *pAVar1;
  AVLTreeNode<int> *pAVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  pAVar1 = this->left;
  if (pAVar1 == (AVLTreeNode<int> *)0x0) {
    iVar4 = 1;
  }
  else {
    iVar4 = pAVar1->count + 1;
  }
  pAVar2 = this->right;
  iVar3 = 0;
  iVar5 = 0;
  if (pAVar2 != (AVLTreeNode<int> *)0x0) {
    iVar5 = pAVar2->count;
  }
  this->count = iVar4 + iVar5;
  if (pAVar1 != (AVLTreeNode<int> *)0x0) {
    iVar3 = pAVar1->height;
  }
  if (pAVar2 == (AVLTreeNode<int> *)0x0) {
    iVar4 = 0;
  }
  else {
    iVar4 = pAVar2->height;
  }
  if (iVar4 < iVar3) {
    iVar4 = iVar3;
  }
  this->height = iVar4 + 1;
  return;
}

Assistant:

void AVLTreeNode<T>::updateValues() {
    count = (left != nullptr ? left->count : 0) + (right != nullptr ? right->count : 0) + 1;

    height = std::max(left != nullptr ? left->height : 0, right != nullptr ? right->height : 0) + 1;
  }